

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

NeuralNetworkImageScaler * __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::mutable_scaler(NeuralNetworkPreprocessing *this)

{
  bool bVar1;
  NeuralNetworkImageScaler *this_00;
  NeuralNetworkPreprocessing *this_local;
  
  bVar1 = has_scaler(this);
  if (!bVar1) {
    clear_preprocessor(this);
    set_has_scaler(this);
    this_00 = (NeuralNetworkImageScaler *)operator_new(0x28);
    NeuralNetworkImageScaler::NeuralNetworkImageScaler(this_00);
    (this->preprocessor_).scaler_ = this_00;
  }
  return (this->preprocessor_).scaler_;
}

Assistant:

inline ::CoreML::Specification::NeuralNetworkImageScaler* NeuralNetworkPreprocessing::mutable_scaler() {
  if (!has_scaler()) {
    clear_preprocessor();
    set_has_scaler();
    preprocessor_.scaler_ = new ::CoreML::Specification::NeuralNetworkImageScaler;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkPreprocessing.scaler)
  return preprocessor_.scaler_;
}